

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::ComputeSubRange::operator()
          (ComputeSubRange *this,Random *random,float dstMin,float dstMax,float *aMin,float *aMax,
          float *bMin,float *bMax)

{
  deUint32 dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = dstMax - dstMin;
  dVar1 = deRandom_getUint32(&random->m_rnd);
  fVar4 = (float)(int)(dVar1 % ((int)(fVar3 + fVar3) + 1U)) * 0.5 + 0.0;
  dVar1 = deRandom_getUint32(&random->m_rnd);
  fVar2 = (float)(dVar1 % 0x21) * 0.5 + -8.0;
  *aMin = dstMin + fVar2;
  *aMax = dstMin + fVar2 + fVar4;
  *bMin = fVar2 - (fVar3 - fVar4);
  *bMax = fVar2;
  return;
}

Assistant:

void ComputeSubRange::operator() (de::Random& random, T dstMin, T dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& rnd, int min, int max) const		{ return rnd.getInt(min, max); }
		float	operator() (de::Random& rnd, float min, float max) const	{ return getQuantizedFloat(rnd, min, max, 0.5f); }
	};

	T rangeLen		= dstMax-dstMin;
	T subRangeLen	= GetRandom()(random, T(0), rangeLen);
	T aOffset		= GetRandom()(random, T(-8), T(8));

	aMin			= dstMin+aOffset;
	aMax			= aMin+subRangeLen;

	bMin			= aOffset-(rangeLen-subRangeLen);
	bMax			= aOffset;

#if defined(DE_DEBUG)
	T eps = T(0.001);
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin-bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin-bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax-bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax-bMax, dstMin-eps, dstMax+eps));
#endif
}